

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsInterface.cpp
# Opt level: O2

void __thiscall Highs::reportModelStats(Highs *this)

{
  HighsHessian *this_00;
  HighsLogOptions *log_options_;
  double dVar1;
  HighsVarType HVar2;
  pointer pHVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  ostream *poVar8;
  char *pcVar9;
  ulong uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  string problem_type;
  undefined8 local_1d8 [4];
  stringstream stats_line;
  ostream local_1a8;
  
  if (*(this->options_).super_HighsOptionsStruct.log_options.output_flag == true) {
    this_00 = &(this->model_).hessian_;
    log_options_ = &(this->options_).super_HighsOptionsStruct.log_options;
    pHVar3 = (this->model_).lp_.integrality_.
             super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar4 = *(int *)&(this->model_).lp_.integrality_.
                     super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
                     super__Vector_impl_data._M_finish - (int)pHVar3;
    uVar10 = 0;
    uVar7 = (ulong)uVar4;
    if ((int)uVar4 < 1) {
      uVar7 = uVar10;
    }
    uVar12 = 0;
    uVar4 = 0;
    uVar13 = 0;
    uVar11 = 0;
    for (; uVar7 != uVar10; uVar10 = uVar10 + 1) {
      HVar2 = pHVar3[uVar10];
      if (HVar2 == kSemiInteger) {
        uVar4 = uVar4 + 1;
      }
      else if (HVar2 == kSemiContinuous) {
        uVar12 = uVar12 + 1;
      }
      else if (HVar2 == kInteger) {
        uVar11 = uVar11 + 1;
        dVar1 = (this->model_).lp_.col_lower_.super__Vector_base<double,_std::allocator<double>_>.
                _M_impl.super__Vector_impl_data._M_start[uVar10];
        if ((((dVar1 == 0.0) && (!NAN(dVar1))) &&
            (dVar1 = (this->model_).lp_.col_upper_.
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar10], dVar1 == 1.0)) && (!NAN(dVar1))) {
          uVar13 = uVar13 + 1;
        }
      }
    }
    problem_type._M_dataplus._M_p = (pointer)&problem_type.field_2;
    problem_type._M_string_length = 0;
    problem_type.field_2._M_local_buf[0] = '\0';
    std::__cxx11::string::assign((char *)&problem_type);
    uVar5 = HighsSparseMatrix::numNz(&(this->model_).lp_.a_matrix_);
    if (this_00->dim_ < 1) {
      uVar6 = 0;
    }
    else {
      uVar6 = HighsHessian::numNz(this_00);
    }
    if (*(this->options_).super_HighsOptionsStruct.log_options.log_dev_level == 0) {
      std::__cxx11::stringstream::stringstream((stringstream *)&stats_line);
      std::operator<<(&local_1a8,(string *)&problem_type);
      if ((this->model_).lp_.model_name_._M_string_length != 0) {
        poVar8 = std::operator<<(&local_1a8," ");
        std::operator<<(poVar8,(string *)&(this->model_).lp_.model_name_);
      }
      poVar8 = std::operator<<(&local_1a8," has ");
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,(this->model_).lp_.num_row_);
      poVar8 = std::operator<<(poVar8," rows; ");
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,(this->model_).lp_.num_col_);
      std::operator<<(poVar8," cols");
      if (uVar6 == 0) {
        poVar8 = std::operator<<(&local_1a8,"; ");
        poVar8 = (ostream *)std::ostream::operator<<(poVar8,uVar5);
        pcVar9 = " nonzeros";
      }
      else {
        poVar8 = std::operator<<(&local_1a8,"; ");
        poVar8 = (ostream *)std::ostream::operator<<(poVar8,uVar5);
        std::operator<<(poVar8," matrix nonzeros");
        poVar8 = std::operator<<(&local_1a8,"; ");
        poVar8 = (ostream *)std::ostream::operator<<(poVar8,uVar6);
        pcVar9 = " Hessian nonzeros";
      }
      std::operator<<(poVar8,pcVar9);
      if (uVar11 != 0) {
        poVar8 = std::operator<<(&local_1a8,"; ");
        poVar8 = (ostream *)std::ostream::operator<<(poVar8,uVar11);
        poVar8 = std::operator<<(poVar8," integer variables (");
        poVar8 = (ostream *)std::ostream::operator<<(poVar8,uVar13);
        std::operator<<(poVar8," binary)");
      }
      if (uVar12 != 0) {
        poVar8 = std::operator<<(&local_1a8,"; ");
        poVar8 = (ostream *)std::ostream::operator<<(poVar8,uVar12);
        std::operator<<(poVar8," semi-continuous variables");
      }
      if (uVar4 != 0) {
        poVar8 = std::operator<<(&local_1a8,"; ");
        poVar8 = (ostream *)std::ostream::operator<<(poVar8,uVar4);
        std::operator<<(poVar8," semi-integer variables");
      }
      std::__cxx11::stringbuf::str();
      highsLogUser(log_options_,kInfo,"%s\n",local_1d8[0]);
      std::__cxx11::string::~string((string *)local_1d8);
      std::__cxx11::stringstream::~stringstream((stringstream *)&stats_line);
    }
    else {
      highsLogDev(log_options_,kInfo,"%4s      : %s\n",problem_type._M_dataplus._M_p,
                  (this->model_).lp_.model_name_._M_dataplus._M_p);
      highsLogDev(log_options_,kInfo,"Rows      : %d\n",(ulong)(uint)(this->model_).lp_.num_row_);
      highsLogDev(log_options_,kInfo,"Cols      : %d\n",(ulong)(uint)(this->model_).lp_.num_col_);
      if (uVar6 == 0) {
        pcVar9 = "Nonzeros  : %d\n";
      }
      else {
        highsLogDev(log_options_,kInfo,"Matrix Nz : %d\n",(ulong)uVar5);
        pcVar9 = "Hessian Nz: %d\n";
        uVar5 = uVar6;
      }
      highsLogDev(log_options_,kInfo,pcVar9,(ulong)uVar5);
      if (uVar11 != 0) {
        highsLogDev(log_options_,kInfo,"Integer   : %d (%d binary)\n",(ulong)uVar11,(ulong)uVar13);
      }
      if (uVar12 != 0) {
        highsLogDev(log_options_,kInfo,"SemiConts : %d\n",(ulong)uVar12);
      }
      if (uVar4 != 0) {
        highsLogDev(log_options_,kInfo,"SemiInt   : %d\n",(ulong)uVar4);
      }
    }
    std::__cxx11::string::~string((string *)&problem_type);
  }
  return;
}

Assistant:

void Highs::reportModelStats() const {
  const HighsLp& lp = this->model_.lp_;
  const HighsHessian& hessian = this->model_.hessian_;
  const HighsLogOptions& log_options = this->options_.log_options;
  if (!*log_options.output_flag) return;
  HighsInt num_integer = 0;
  HighsInt num_binary = 0;
  HighsInt num_semi_continuous = 0;
  HighsInt num_semi_integer = 0;
  for (HighsInt iCol = 0; iCol < static_cast<HighsInt>(lp.integrality_.size());
       iCol++) {
    switch (lp.integrality_[iCol]) {
      case HighsVarType::kInteger:
        num_integer++;
        if (lp.col_lower_[iCol] == 0 && lp.col_upper_[iCol] == 1) num_binary++;
        break;
      case HighsVarType::kSemiContinuous:
        num_semi_continuous++;
        break;
      case HighsVarType::kSemiInteger:
        num_semi_integer++;
        break;
      default:
        break;
    }
  }
  std::string problem_type;
  const bool non_continuous =
      num_integer + num_semi_continuous + num_semi_integer;
  if (hessian.dim_) {
    if (non_continuous) {
      problem_type = "MIQP";
    } else {
      problem_type = "QP  ";
    }
  } else {
    if (non_continuous) {
      problem_type = "MIP ";
    } else {
      problem_type = "LP  ";
    }
  }
  const HighsInt a_num_nz = lp.a_matrix_.numNz();
  const HighsInt q_num_nz = hessian.dim_ > 0 ? hessian.numNz() : 0;
  if (*log_options.log_dev_level) {
    highsLogDev(log_options, HighsLogType::kInfo, "%4s      : %s\n",
                problem_type.c_str(), lp.model_name_.c_str());
    highsLogDev(log_options, HighsLogType::kInfo,
                "Rows      : %" HIGHSINT_FORMAT "\n", lp.num_row_);
    highsLogDev(log_options, HighsLogType::kInfo,
                "Cols      : %" HIGHSINT_FORMAT "\n", lp.num_col_);
    if (q_num_nz) {
      highsLogDev(log_options, HighsLogType::kInfo,
                  "Matrix Nz : %" HIGHSINT_FORMAT "\n", a_num_nz);
      highsLogDev(log_options, HighsLogType::kInfo,
                  "Hessian Nz: %" HIGHSINT_FORMAT "\n", q_num_nz);
    } else {
      highsLogDev(log_options, HighsLogType::kInfo,
                  "Nonzeros  : %" HIGHSINT_FORMAT "\n", a_num_nz);
    }
    if (num_integer)
      highsLogDev(log_options, HighsLogType::kInfo,
                  "Integer   : %" HIGHSINT_FORMAT " (%" HIGHSINT_FORMAT
                  " binary)\n",
                  num_integer, num_binary);
    if (num_semi_continuous)
      highsLogDev(log_options, HighsLogType::kInfo,
                  "SemiConts : %" HIGHSINT_FORMAT "\n", num_semi_continuous);
    if (num_semi_integer)
      highsLogDev(log_options, HighsLogType::kInfo,
                  "SemiInt   : %" HIGHSINT_FORMAT "\n", num_semi_integer);
  } else {
    std::stringstream stats_line;
    stats_line << problem_type;
    if (lp.model_name_.length()) stats_line << " " << lp.model_name_;
    stats_line << " has " << lp.num_row_ << " rows; " << lp.num_col_ << " cols";
    if (q_num_nz) {
      stats_line << "; " << a_num_nz << " matrix nonzeros";
      stats_line << "; " << q_num_nz << " Hessian nonzeros";
    } else {
      stats_line << "; " << a_num_nz << " nonzeros";
    }
    if (num_integer)
      stats_line << "; " << num_integer << " integer variables (" << num_binary
                 << " binary)";
    if (num_semi_continuous)
      stats_line << "; " << num_semi_continuous << " semi-continuous variables";
    if (num_semi_integer)
      stats_line << "; " << num_semi_integer << " semi-integer variables";
    highsLogUser(log_options, HighsLogType::kInfo, "%s\n",
                 stats_line.str().c_str());
  }
}